

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

bool __thiscall
QColorDialogPrivate::handleColorPickingMouseButtonRelease(QColorDialogPrivate *this,QMouseEvent *e)

{
  QColorDialogPrivate *this_00;
  long in_FS_OFFSET;
  QColor QVar1;
  undefined1 local_38 [16];
  QPoint local_28;
  QColor local_20;
  long local_10;
  
  this_00 = (QColorDialogPrivate *)local_38;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (undefined1  [16])QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
  local_28 = QPointF::toPoint((QPointF *)local_38);
  QVar1 = grabScreenColor(this_00,&local_28);
  local_20._0_8_ = QVar1._0_8_;
  local_20.ct._4_4_ = QVar1.ct._4_4_;
  local_20.ct.argb.pad = QVar1.ct._8_2_;
  setCurrentColor(this,&local_20,SetColorAll);
  releaseColorPicking(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QColorDialogPrivate::handleColorPickingMouseButtonRelease(QMouseEvent *e)
{
    setCurrentColor(grabScreenColor(e->globalPosition().toPoint()), SetColorAll);
    releaseColorPicking();
    return true;
}